

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O1

void __thiscall bssl::SSL_CONFIG::~SSL_CONFIG(SSL_CONFIG *this)

{
  _Head_base<0UL,_ssl_ctx_st_*,_false> _Var1;
  
  _Var1._M_head_impl =
       (this->ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (ssl_ctx_st *)0x0) {
    (*(_Var1._M_head_impl)->x509_method->ssl_config_free)(this);
  }
  Array<unsigned_char>::~Array(&this->client_ech_config_list);
  std::unique_ptr<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter>::~unique_ptr
            (&this->srtp_profiles);
  Array<unsigned_short>::~Array(&this->verify_sigalgs);
  Array<unsigned_char>::~Array(&this->quic_early_data_context);
  Array<unsigned_char>::~Array(&this->quic_transport_params);
  Vector<bssl::ALPSConfig>::~Vector(&this->alps_configs);
  Array<unsigned_char>::~Array(&this->alpn_client_proto_list);
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&this->channel_id_private);
  Array<unsigned_short>::~Array(&this->supported_group_list);
  if ((this->requested_trust_anchors).super__Optional_base<bssl::Array<unsigned_char>,_false,_false>
      ._M_payload.super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
      super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_engaged == true) {
    (this->requested_trust_anchors).super__Optional_base<bssl::Array<unsigned_char>,_false,_false>.
    _M_payload.super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
    super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_engaged = false;
    Array<unsigned_char>::~Array((Array<unsigned_char> *)&this->requested_trust_anchors);
  }
  std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr(&this->CA_names);
  std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr(&this->client_CA);
  std::unique_ptr<char,_bssl::internal::Deleter>::~unique_ptr(&this->psk_identity_hint);
  std::unique_ptr<bssl::CERT,_bssl::internal::Deleter>::~unique_ptr(&this->cert);
  std::unique_ptr<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>::~unique_ptr
            (&this->cipher_list);
  return;
}

Assistant:

SSL_CONFIG::~SSL_CONFIG() {
  if (ssl->ctx != nullptr) {
    ssl->ctx->x509_method->ssl_config_free(this);
  }
}